

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O1

void __thiscall TestOutput::printFileAndLineForTestAndFailure(TestOutput *this,TestFailure *failure)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  undefined4 extraout_var_00;
  SimpleString SStack_48;
  SimpleString local_38;
  SimpleString local_28;
  
  (*failure->_vptr_TestFailure[7])(&local_28);
  iVar1 = (*failure->_vptr_TestFailure[8])(failure);
  printErrorInFileOnLineFormattedForWorkingEnvironment(this,&local_28,CONCAT44(extraout_var,iVar1));
  SimpleString::~SimpleString(&local_28);
  (*failure->_vptr_TestFailure[3])(&local_38,failure);
  (*this->_vptr_TestOutput[0xb])(this," Failure in ");
  pcVar2 = SimpleString::asCharString(&local_38);
  (*this->_vptr_TestOutput[0xb])(this,pcVar2);
  SimpleString::~SimpleString(&local_38);
  (*failure->_vptr_TestFailure[2])(&SStack_48,failure);
  iVar1 = (*failure->_vptr_TestFailure[5])(failure);
  printErrorInFileOnLineFormattedForWorkingEnvironment
            (this,&SStack_48,CONCAT44(extraout_var_00,iVar1));
  SimpleString::~SimpleString(&SStack_48);
  return;
}

Assistant:

void TestOutput::printFileAndLineForTestAndFailure(const TestFailure& failure)
{
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getTestFileName(), failure.getTestLineNumber());
    printFailureInTest(failure.getTestName());
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getFileName(), failure.getFailureLineNumber());
}